

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advconsole.unix.cpp
# Opt level: O1

void AdvancedConsole::Cursor::getSize(int *rows,int *cols)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iTempCol;
  int iTempRow;
  int iOldCol;
  int iOldRow;
  int local_5c;
  int *local_58;
  int *local_50;
  Cursor local_44;
  int local_38;
  int local_34;
  
  local_58 = rows;
  local_50 = cols;
  getPosition(&local_34,&local_38);
  iVar2 = local_34;
  iVar4 = local_38;
  do {
    iVar3 = iVar2;
    Cursor(&local_44,100,100,AC_RELATIVE);
    operator<<((ostream *)&std::cout,&local_44);
    getPosition(&local_44.r,&local_5c);
    bVar1 = iVar4 != local_5c;
    iVar2 = local_44.r;
    iVar4 = local_5c;
  } while (bVar1 || local_44.r != iVar3);
  Cursor(&local_44,local_34,local_38,AC_ABSOLUTE);
  operator<<((ostream *)&std::cout,&local_44);
  *local_58 = iVar3;
  *local_50 = local_5c;
  return;
}

Assistant:

void AdvancedConsole::Cursor::getSize(int& rows, int& cols)
{
	int iOldRow, iOldCol;
	getPosition(iOldRow, iOldCol);
	
	int iTempLastRow = iOldRow, iTempLastCol = iOldCol;
	while (true)
	{
		cout << Cursor(100, 100, AC_RELATIVE);
		int iTempRow, iTempCol;
		getPosition(iTempRow, iTempCol);
		
		if (iTempRow != iTempLastRow || iTempCol != iTempLastCol)
		{
			iTempLastRow = iTempRow;
			iTempLastCol = iTempCol;
		}
		else
			break;
	}
	
	cout << Cursor(iOldRow, iOldCol, AC_ABSOLUTE);
	rows = iTempLastRow;
	cols = iTempLastCol;
}